

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  undefined8 uVar1;
  Disposer *pDVar2;
  AttachmentPromiseNodeBase *this_00;
  _func_int **in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  undefined8 unaff_RBX;
  AsyncPump *ptrCopy;
  undefined8 uVar4;
  Promise<unsigned_long> PVar5;
  undefined8 *local_70;
  anon_union_16_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 local_68;
  Promise<unsigned_long> promise;
  NullableValue<kj::Promise<unsigned_long>_> result;
  
  (**(code **)(*(long *)amount + 0x10))((PromiseNode *)&local_70,amount,output);
  uVar1 = local_68.value.super_PromiseBase.node.ptr;
  result.isSet = local_70._0_1_;
  uVar4 = (PromiseNode *)&local_70;
  if (local_70._0_1_ == true) {
    result.field_1.value.super_PromiseBase.node.disposer =
         local_68.value.super_PromiseBase.node.disposer;
    result.field_1.value.super_PromiseBase.node.ptr = local_68.value.super_PromiseBase.node.ptr;
    local_68.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    unaff_RBX = local_68.value.super_PromiseBase.node.disposer;
    uVar4 = uVar1;
  }
  _::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue
            ((NullableValue<kj::Promise<unsigned_long>_> *)&local_70);
  if (local_70._0_1_ == false) {
    _::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue(&result);
    pDVar2 = (Disposer *)operator_new(0x1020);
    pDVar2->_vptr_Disposer = (_func_int **)output;
    pDVar2[1]._vptr_Disposer = (_func_int **)amount;
    pDVar2[2]._vptr_Disposer = in_RCX;
    pDVar2[3]._vptr_Disposer = (_func_int **)0x0;
    anon_unknown_77::AsyncPump::pump((AsyncPump *)&promise);
    this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
    _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&promise);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042fe40;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncPump>::instance;
    this_00[1].dependency.disposer = pDVar2;
    local_70 = &_::
                HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump>>>
                ::instance;
    result._0_8_ = &_::
                    HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump>>>
                    ::instance;
    local_68.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
    this->_vptr_AsyncInputStream =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump>>>
          ::instance;
    this[1]._vptr_AsyncInputStream = (_func_int **)this_00;
    result.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result);
    Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump>_>_>::~Own
              ((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump>_>_> *
               )&local_70);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
    pPVar3 = extraout_RDX_00;
  }
  else {
    this->_vptr_AsyncInputStream = (_func_int **)unaff_RBX;
    this[1]._vptr_AsyncInputStream = (_func_int **)uVar4;
    result.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    _::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue(&result);
    pPVar3 = extraout_RDX;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar3;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar5.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_MAYBE(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(*result);
  }

  // OK, fall back to naive approach.
  auto pump = heap<AsyncPump>(*this, output, amount);
  auto promise = pump->pump();
  return promise.attach(kj::mv(pump));
}